

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

tc_toktyp_t __thiscall
CTcTokenizer::actual_splice_next_line
          (CTcTokenizer *this,CTcTokString *srcbuf,utf8_ptr *src,CTcToken *tok)

{
  int iVar1;
  tc_toktyp_t tVar2;
  char *pcVar3;
  utf8_ptr *in_RDX;
  char *in_RDI;
  tc_toktyp_t typ;
  int new_line_ofs;
  int in_stack_00000074;
  tok_embed_ctx *in_stack_00000078;
  CTcToken *in_stack_00000080;
  utf8_ptr *in_stack_00000088;
  CTcTokString *in_stack_00000090;
  size_t in_stack_ffffffffffffffc0;
  utf8_ptr *this_00;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  CTcTokString::append
            ((CTcTokString *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),in_RDI,
             in_stack_ffffffffffffffc0);
  while( true ) {
    iVar1 = read_line((CTcTokenizer *)src,tok._4_4_);
    if (*(int *)(in_RDI + 0x120) != 0) {
      splice_string((CTcTokenizer *)srcbuf);
    }
    if (iVar1 == -1) break;
    this_00 = in_RDX;
    pcVar3 = CTcTokString::get_text((CTcTokString *)(in_RDI + 0xa0));
    utf8_ptr::set(this_00,pcVar3 + iVar1);
    tVar2 = next_on_line(in_stack_00000090,in_stack_00000088,in_stack_00000080,in_stack_00000078,
                         in_stack_00000074);
    if (tVar2 != TOKT_EOF) {
      return tVar2;
    }
  }
  return TOKT_EOF;
}

Assistant:

tc_toktyp_t CTcTokenizer::actual_splice_next_line(
    const CTcTokString *srcbuf, utf8_ptr *src, CTcToken *tok)
{
    /* add a space onto the end of the current line */
    linebuf_.append(" ", 1);

    /* keep going until we find a non-empty line */
    for (;;)
    {
        int new_line_ofs;
        tc_toktyp_t typ;

        /* splice the next line onto the current line */
        new_line_ofs = read_line(TRUE);

        /* 
         *   make sure we read additional lines as needed to complete any
         *   strings left open at the end of the line 
         */
        if (in_quote_ != '\0')
            splice_string();

        /* if there was no more, return end of file */
        if (new_line_ofs == -1)
            return TOKT_EOF;

        /* set the source to the start of the additional line */
        src->set((char *)linebuf_.get_text() + new_line_ofs);

        /* get the next token */
        typ = next_on_line(srcbuf, src, tok, &macro_in_embedding_, TRUE);

        /* if we didn't get EOF, it means we found a non-empty line */
        if (typ != TOKT_EOF)
            return typ;
    }
}